

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::MILSpec::Block::_InternalSerialize
          (Block *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  long lVar2;
  Type *this_00;
  Type *s;
  Type *this_01;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  uint8_t *puVar9;
  size_t sVar10;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_68;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_48;
  
  iVar4 = (this->inputs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    iVar5 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::TypeHandler>
                          (&(this->inputs_).super_RepeatedPtrFieldBase,iVar5);
      *target = '\n';
      uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar1;
      if (uVar1 < 0x80) {
        puVar9 = target + 2;
      }
      else {
        puVar9 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar1,target + 1);
      }
      target = NamedValueType::_InternalSerialize(this_00,puVar9,stream);
      iVar5 = iVar5 + 1;
    } while (iVar4 != iVar5);
  }
  iVar4 = (this->outputs_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar4) {
    iVar5 = 0;
    do {
      s = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(this->outputs_).super_RepeatedPtrFieldBase,iVar5);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
                 "CoreML.Specification.MILSpec.Block.outputs");
      sVar10 = s->_M_string_length;
      if (((long)sVar10 < 0x80) && ((long)sVar10 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\x12';
        target[1] = (uint8_t)sVar10;
        memcpy(target + 2,(s->_M_dataplus)._M_p,sVar10);
        target = target + sVar10 + 2;
      }
      else {
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,2,s,target);
      }
      iVar5 = iVar5 + 1;
    } while (iVar4 != iVar5);
  }
  iVar4 = (this->operations_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    iVar5 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Operation>::TypeHandler>
                          (&(this->operations_).super_RepeatedPtrFieldBase,iVar5);
      *target = '\x1a';
      uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar1;
      if (uVar1 < 0x80) {
        puVar9 = target + 2;
      }
      else {
        puVar9 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar1,target + 1);
      }
      target = Operation::_InternalSerialize(this_01,puVar9,stream);
      iVar5 = iVar5 + 1;
    } while (iVar4 != iVar5);
  }
  uVar7 = (this->attributes_).map_.elements_.num_elements_;
  if (uVar7 != 0) {
    local_48.m_ = (InnerMap *)&this->attributes_;
    if ((uVar7 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
      ::SearchFrom(&local_48,(this->attributes_).map_.elements_.index_of_first_non_null_);
      local_68.bucket_index_ = local_48.bucket_index_;
      local_68.node_ = local_48.node_;
      local_68.m_ = local_48.m_;
      if (local_48.node_ != (Node *)0x0) {
        do {
          target = google::protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                   ::InternalSerialize(4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_68.node_,(Value *)&(local_68.node_)->field_0x20,
                                       target,stream);
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    (*(char **)local_68.node_,(int)*(size_type *)&(local_68.node_)->field_0x8,
                     SERIALIZE,"CoreML.Specification.MILSpec.Block.AttributesEntry.key");
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::InnerMap::
          iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
          ::operator++(&local_68);
        } while (local_68.node_ != (Node *)0x0);
      }
    }
    else {
      puVar3 = (undefined8 *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 << 3);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
      ::SearchFrom(&local_48,(this->attributes_).map_.elements_.index_of_first_non_null_);
      local_68.bucket_index_ = local_48.bucket_index_;
      local_68.node_ = local_48.node_;
      local_68.m_ = local_48.m_;
      if (local_48.node_ != (Node *)0x0) {
        uVar7 = 0;
        puVar8 = puVar3;
        do {
          uVar6 = uVar7;
          *puVar8 = local_68.node_;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::InnerMap::
          iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
          ::operator++(&local_68);
          uVar7 = uVar6 + 1;
          puVar8 = puVar8 + 1;
        } while (local_68.node_ != (Node *)0x0);
        if (uVar7 != 0) {
          lVar2 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>>
                    (puVar3,puVar8,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>>
                    (puVar3,puVar8);
          uVar7 = 0xffffffffffffffff;
          do {
            target = google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                     ::InternalSerialize(4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)puVar3[uVar7 + 1],
                                         (Value *)((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)puVar3[uVar7 + 1] + 1),target,stream);
            google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      (*(char **)puVar3[uVar7 + 1],*(int *)((undefined8 *)puVar3[uVar7 + 1] + 1),
                       SERIALIZE,"CoreML.Specification.MILSpec.Block.AttributesEntry.key");
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
      }
      operator_delete__(puVar3);
    }
  }
  uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    uVar7 = uVar7 & 0xfffffffffffffffc;
    data = *(void **)(uVar7 + 8);
    iVar4 = (int)*(undefined8 *)(uVar7 + 0x10);
    sVar10 = (size_t)iVar4;
    if ((long)stream->end_ - (long)target < (long)sVar10) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,iVar4,target)
      ;
    }
    else {
      memcpy(target,data,sVar10);
      target = target + sVar10;
    }
  }
  return target;
}

Assistant:

uint8_t* Block::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.Block)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.NamedValueType inputs = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_inputs_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_inputs(i), target, stream);
  }

  // repeated string outputs = 2;
  for (int i = 0, n = this->_internal_outputs_size(); i < n; i++) {
    const auto& s = this->_internal_outputs(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.Block.outputs");
    target = stream->WriteString(2, s, target);
  }

  // repeated .CoreML.Specification.MILSpec.Operation operations = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_operations_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_operations(i), target, stream);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 4;
  if (!this->_internal_attributes().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.MILSpec.Block.AttributesEntry.key");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_attributes().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_attributes().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Block_AttributesEntry_DoNotUse::Funcs::InternalSerialize(4, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it) {
        target = Block_AttributesEntry_DoNotUse::Funcs::InternalSerialize(4, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.Block)
  return target;
}